

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffffrw_work(long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
               void *userPtr)

{
  ParseData *lParse;
  Node *pNVar1;
  int iVar2;
  long lVar3;
  
  lParse = *(ParseData **)((long)userPtr + 8);
  Evaluate_Parser(lParse,firstrow,nrows);
  iVar2 = lParse->status;
  if (iVar2 == 0) {
    pNVar1 = lParse->Nodes;
    iVar2 = lParse->resultNode;
    if (pNVar1[iVar2].operation == -1000) {
      if (pNVar1[iVar2].value.data.log != '\0') {
LAB_001332da:
        **userPtr = firstrow;
        return -1;
      }
    }
    else if (0 < nrows) {
      lVar3 = 0;
      do {
        if ((*(char *)((long)pNVar1[iVar2].value.data.dblptr + lVar3) != '\0') &&
           (pNVar1[iVar2].value.undef[lVar3] == '\0')) {
          firstrow = firstrow + lVar3;
          goto LAB_001332da;
        }
        lVar3 = lVar3 + 1;
      } while (nrows != lVar3);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ffffrw_work(long        totalrows, /* I - Total rows to be processed     */
                long        offset,    /* I - Number of rows skipped at start*/
                long        firstrow,  /* I - First row of this iteration    */
                long        nrows,     /* I - Number of rows in this iter    */
                int         nCols,     /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void        *userPtr ) /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and searches for the        */
/* first row which evaluates to TRUE.                                        */
/*---------------------------------------------------------------------------*/
{
    long idx;
    Node *result;
    ffffrw_workdata *workData = userPtr;
    ParseData *lParse = workData->lParse;

    Evaluate_Parser( lParse, firstrow, nrows );

    if( !lParse->status ) {

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) {

          if( result->value.data.log ) {
	     *(workData->prownum) = firstrow;
             return( -1 );
          }

       } else {

          for( idx=0; idx<nrows; idx++ )
             if( result->value.data.logptr[idx] && !result->value.undef[idx] ) {
	        *(workData->prownum) = firstrow + idx;;
                return( -1 );
             }
       }
    }

    return( lParse->status );
}